

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

word Ifn_NtkMatchCollectPerm(Ifn_Ntk_t *p,sat_solver *pSat)

{
  int iVar1;
  uint local_2c;
  int local_28;
  int Mint;
  int v;
  int i;
  word Perm;
  sat_solver *pSat_local;
  Ifn_Ntk_t *p_local;
  
  _v = 0;
  Perm = (word)pSat;
  pSat_local = (sat_solver *)p;
  if (p->nParsVNum < 5) {
    for (Mint = 0; Mint < pSat_local->size; Mint = Mint + 1) {
      local_2c = 0;
      for (local_28 = 0; local_28 < pSat_local[2].hProofPivot; local_28 = local_28 + 1) {
        iVar1 = sat_solver_var_value
                          ((sat_solver *)Perm,
                           pSat_local[2].VarActType + Mint * pSat_local[2].hProofPivot + local_28);
        if (iVar1 != 0) {
          local_2c = 1 << ((byte)local_28 & 0x1f) | local_2c;
        }
      }
      Abc_TtSetHex((word *)&v,Mint,local_2c);
    }
    return _v;
  }
  __assert_fail("p->nParsVNum <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                ,0x50f,"word Ifn_NtkMatchCollectPerm(Ifn_Ntk_t *, sat_solver *)");
}

Assistant:

word Ifn_NtkMatchCollectPerm( Ifn_Ntk_t * p, sat_solver * pSat )
{
    word Perm = 0;
    int i, v, Mint;
    assert( p->nParsVNum <= 4 );
    for ( i = 0; i < p->nInps; i++ )
    {
        for ( Mint = v = 0; v < p->nParsVNum; v++ )
            if ( sat_solver_var_value(pSat, p->nParsVIni + i * p->nParsVNum + v) )
                Mint |= (1 << v);
        Abc_TtSetHex( &Perm, i, Mint );
    }
    return Perm;
}